

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O0

void __thiscall
rr::MultiSampleLineRasterizer::rasterize
          (MultiSampleLineRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  float fVar1;
  float *pfVar2;
  float *__b;
  float *local_78;
  int local_5c;
  float removedValue_1;
  int fragNdx_1;
  int packNdx_1;
  int numPacketsRasterized2;
  float *nextDepthValues;
  FragmentPacket *nextFragmentPackets;
  int local_38;
  float removedValue;
  int fragNdx;
  int packNdx;
  int *numPacketsRasterized_local;
  float *pfStack_20;
  int maxFragmentPackets_local;
  float *depthValues_local;
  FragmentPacket *fragmentPackets_local;
  MultiSampleLineRasterizer *this_local;
  
  _fragNdx = numPacketsRasterized;
  numPacketsRasterized_local._4_4_ = maxFragmentPackets;
  pfStack_20 = depthValues;
  depthValues_local = (float *)fragmentPackets;
  fragmentPackets_local = (FragmentPacket *)this;
  TriangleRasterizer::rasterize
            (&this->m_triangleRasterizer0,fragmentPackets,depthValues,maxFragmentPackets,
             numPacketsRasterized);
  for (removedValue = 0.0; (int)removedValue < *_fragNdx;
      removedValue = (float)((int)removedValue + 1)) {
    for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
      pfVar2 = tcu::Vector<float,_4>::operator[]
                         ((Vector<float,_4> *)
                          (depthValues_local + (long)(int)removedValue * 0x10 + 0xc),local_38);
      nextFragmentPackets._4_4_ = *pfVar2;
      pfVar2 = tcu::Vector<float,_4>::operator[]
                         ((Vector<float,_4> *)
                          (depthValues_local + (long)(int)removedValue * 0x10 + 0xc),local_38);
      fVar1 = nextFragmentPackets._4_4_;
      *pfVar2 = 0.0;
      pfVar2 = tcu::Vector<float,_4>::operator[]
                         ((Vector<float,_4> *)
                          (depthValues_local + (long)(int)removedValue * 0x10 + 8),local_38);
      *pfVar2 = fVar1 + *pfVar2;
    }
  }
  if (*_fragNdx != numPacketsRasterized_local._4_4_) {
    nextDepthValues = depthValues_local + (long)*_fragNdx * 0x10;
    if (pfStack_20 == (float *)0x0) {
      local_78 = (float *)0x0;
    }
    else {
      local_78 = pfStack_20 + *_fragNdx * 4 * this->m_numSamples;
    }
    _packNdx_1 = local_78;
    fragNdx_1 = 0;
    TriangleRasterizer::rasterize
              (&this->m_triangleRasterizer1,(FragmentPacket *)nextDepthValues,local_78,
               numPacketsRasterized_local._4_4_ - *_fragNdx,&fragNdx_1);
    *_fragNdx = fragNdx_1 + *_fragNdx;
    for (removedValue_1 = 0.0; (int)removedValue_1 < fragNdx_1;
        removedValue_1 = (float)((int)removedValue_1 + 1)) {
      for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
        pfVar2 = tcu::Vector<float,_4>::operator[]
                           ((Vector<float,_4> *)
                            (nextDepthValues + (long)(int)removedValue_1 * 0x10 + 0xc),local_5c);
        fVar1 = *pfVar2;
        pfVar2 = tcu::Vector<float,_4>::operator[]
                           ((Vector<float,_4> *)
                            (nextDepthValues + (long)(int)removedValue_1 * 0x10 + 0xc),local_5c);
        *pfVar2 = 0.0;
        pfVar2 = tcu::Vector<float,_4>::operator[]
                           ((Vector<float,_4> *)
                            (nextDepthValues + (long)(int)removedValue_1 * 0x10 + 8),local_5c);
        *pfVar2 = fVar1 + *pfVar2;
        pfVar2 = tcu::Vector<float,_4>::operator[]
                           ((Vector<float,_4> *)
                            (nextDepthValues + (long)(int)removedValue_1 * 0x10 + 4),local_5c);
        __b = tcu::Vector<float,_4>::operator[]
                        ((Vector<float,_4> *)
                         (nextDepthValues + (long)(int)removedValue_1 * 0x10 + 8),local_5c);
        std::swap<float>(pfVar2,__b);
      }
    }
  }
  return;
}

Assistant:

void MultiSampleLineRasterizer::rasterize (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	m_triangleRasterizer0.rasterize(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);

	// Remove 3rd barycentric value and rebalance. Lines do not have non-zero barycentric at index 2
	for (int packNdx = 0; packNdx < numPacketsRasterized; ++packNdx)
	for (int fragNdx = 0; fragNdx < 4; fragNdx++)
	{
		float removedValue = fragmentPackets[packNdx].barycentric[2][fragNdx];
		fragmentPackets[packNdx].barycentric[2][fragNdx] = 0.0f;
		fragmentPackets[packNdx].barycentric[1][fragNdx] += removedValue;
	}

	// rasterizer 0 filled the whole buffer?
	if (numPacketsRasterized == maxFragmentPackets)
		return;

	{
		FragmentPacket* const nextFragmentPackets	= fragmentPackets + numPacketsRasterized;
		float* nextDepthValues						= (depthValues) ? (depthValues+4*numPacketsRasterized*m_numSamples) : (DE_NULL);
		int numPacketsRasterized2					= 0;

		m_triangleRasterizer1.rasterize(nextFragmentPackets, nextDepthValues, maxFragmentPackets - numPacketsRasterized, numPacketsRasterized2);

		numPacketsRasterized += numPacketsRasterized2;

		// Fix swapped barycentrics in the second triangle
		for (int packNdx = 0; packNdx < numPacketsRasterized2; ++packNdx)
		for (int fragNdx = 0; fragNdx < 4; fragNdx++)
		{
			float removedValue = nextFragmentPackets[packNdx].barycentric[2][fragNdx];
			nextFragmentPackets[packNdx].barycentric[2][fragNdx] = 0.0f;
			nextFragmentPackets[packNdx].barycentric[1][fragNdx] += removedValue;

			// edge has reversed direction
			std::swap(nextFragmentPackets[packNdx].barycentric[0][fragNdx], nextFragmentPackets[packNdx].barycentric[1][fragNdx]);
		}
	}
}